

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O2

void __thiscall
duckdb::PatasGroupState<unsigned_long>::LoadPackedData
          (PatasGroupState<unsigned_long> *this,uint16_t *packed_data,idx_t count)

{
  ushort uVar1;
  idx_t iVar2;
  uint8_t *puVar3;
  
  puVar3 = &this->unpacked_data[0].index_diff;
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    uVar1 = packed_data[iVar2];
    *puVar3 = (byte)(uVar1 >> 9);
    ((PatasUnpackedValueStats *)(puVar3 + -2))->significant_bytes = (byte)(uVar1 >> 6) & 7;
    puVar3[-1] = (byte)uVar1 & 0x3f;
    puVar3 = puVar3 + 3;
  }
  return;
}

Assistant:

void LoadPackedData(uint16_t *packed_data, idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			auto &unpacked = unpacked_data[i];
			PackedDataUtils<EXACT_TYPE>::Unpack(packed_data[i], (UnpackedData &)unpacked);
		}
	}